

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_50a29::SetExpr::_parse(SetExpr *this,Context *con)

{
  bool bVar1;
  const_reference cVar2;
  char32_t cVar3;
  size_type sVar4;
  size_t ch;
  Context *con_local;
  SetExpr *this_local;
  
  bVar1 = pegmatite::Context::end(con);
  if (!bVar1) {
    cVar3 = pegmatite::Context::symbol(con);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(&this->mSetExpr);
    if (((uint)cVar3 < sVar4) &&
       (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->mSetExpr,(ulong)(uint)cVar3), cVar2)) {
      pegmatite::Context::next_col(con);
      return true;
    }
  }
  pegmatite::Context::set_error_pos(con);
  return false;
}

Assistant:

bool _parse(Context &con) const
	{
		if (!con.end())
		{
			size_t ch = con.symbol();
			if (ch < mSetExpr.size() && mSetExpr[ch])
			{
				con.next_col();
				return true;
			}
		}
		con.set_error_pos();
		return false;
	}